

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h8_w4_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  ushort uVar25;
  uint uVar26;
  int in_EDX;
  undefined8 *in_RSI;
  s16 *in_RDI;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  s16 tmp [32];
  __m256i min_val;
  __m256i max_val;
  int i_src3;
  int i_src2;
  int i_src;
  int j;
  __m256i off;
  __m256i c16_p32_p32;
  __m256i c16_n32_p32;
  __m256i c16_n42_p17;
  __m256i c16_p17_p42;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m256i t1;
  __m256i t0;
  __m256i o1;
  __m256i o0;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  s16 local_d80 [4];
  undefined8 uStack_d78;
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [28];
  int local_d34;
  undefined8 *local_d30;
  int local_cc4;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [224];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  byte local_a54;
  char local_a50;
  undefined8 *local_a48;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_90;
  undefined8 uStack_88;
  
  local_d34 = in_EDX;
  local_d30 = in_RSI;
  dct2_butterfly_h8_sse(in_RDI,4,local_d80,4,5,0xf);
  uVar26 = 0x14 - local_d34;
  local_a48 = local_d30;
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar2 = vpinsrd_avx(auVar2,0x11002a,2);
  auVar2 = vpinsrd_avx(auVar2,0x11002a,3);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar2 = vpinsrd_avx(auVar2,0xffd60011,2);
  auVar2 = vpinsrd_avx(auVar2,0xffd60011,3);
  auVar3 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar3 = vpinsrd_avx(auVar3,0xffd60011,2);
  auVar3 = vpinsrd_avx(auVar3,0xffd60011,3);
  uStack_230 = auVar3._0_8_;
  uStack_228 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar3 = vpinsrd_avx(auVar3,0xffe00020,2);
  auVar3 = vpinsrd_avx(auVar3,0xffe00020,3);
  auVar4 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar4 = vpinsrd_avx(auVar4,0xffe00020,2);
  auVar4 = vpinsrd_avx(auVar4,0xffe00020,3);
  uStack_270 = auVar4._0_8_;
  uStack_268 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar4 = vpinsrd_avx(auVar4,0x200020,2);
  auVar4 = vpinsrd_avx(auVar4,0x200020,3);
  auVar29 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar29 = vpinsrd_avx(auVar29,0x200020,2);
  auVar29 = vpinsrd_avx(auVar29,0x200020,3);
  uStack_2b0 = auVar29._0_8_;
  uStack_2a8 = auVar29._8_8_;
  local_a50 = (char)uVar26;
  uVar24 = 1 << (local_a50 - 1U & 0x1f);
  auVar29 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar29 = vpinsrd_avx(auVar29,uVar24,2);
  auVar29 = vpinsrd_avx(auVar29,uVar24,3);
  auVar27 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar27 = vpinsrd_avx(auVar27,uVar24,2);
  auVar27 = vpinsrd_avx(auVar27,uVar24,3);
  auVar27 = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar27;
  auVar29 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar29;
  uStack_2f0 = auVar29._0_8_;
  uStack_2e8 = auVar29._8_8_;
  local_cc4 = 0;
  while( true ) {
    if (7 < local_cc4) break;
    uVar12 = *(undefined8 *)(local_d80 + local_cc4);
    uVar13 = *(undefined8 *)((long)&uStack_d78 + (long)local_cc4 * 2);
    auVar29._8_8_ = uVar13;
    auVar29._0_8_ = uVar12;
    auVar28 = vpunpcklwd_avx(auVar29,*(undefined1 (*) [16])(local_d60 + (long)local_cc4 * 2));
    auVar30._8_8_ = uVar13;
    auVar30._0_8_ = uVar12;
    auVar29 = vpunpckhwd_avx(auVar30,*(undefined1 (*) [16])(local_d60 + (long)local_cc4 * 2));
    auVar5 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_d70 + (long)local_cc4 * 2),
                            *(undefined1 (*) [16])(local_d50 + (long)local_cc4 * 2));
    auVar30 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_d70 + (long)local_cc4 * 2),
                             *(undefined1 (*) [16])(local_d50 + (long)local_cc4 * 2));
    local_ac0 = auVar29._0_8_;
    uStack_ab8 = auVar29._8_8_;
    local_ae0 = auVar30._0_8_;
    uStack_ad8 = auVar30._8_8_;
    auVar15._16_8_ = local_ac0;
    auVar15._0_16_ = auVar28;
    auVar15._24_8_ = uStack_ab8;
    auVar8._16_8_ = uStack_2b0;
    auVar8._0_16_ = auVar4;
    auVar8._24_8_ = uStack_2a8;
    auVar8 = vpmaddwd_avx2(auVar15,auVar8);
    auVar14._16_8_ = local_ac0;
    auVar14._0_16_ = auVar28;
    auVar14._24_8_ = uStack_ab8;
    auVar9._16_8_ = uStack_270;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_268;
    auVar9 = vpmaddwd_avx2(auVar14,auVar9);
    auVar11._16_8_ = local_ae0;
    auVar11._0_16_ = auVar5;
    auVar11._24_8_ = uStack_ad8;
    auVar10._16_8_ = uStack_1f0;
    auVar10._0_16_ = auVar1;
    auVar10._24_8_ = uStack_1e8;
    auVar10 = vpmaddwd_avx2(auVar11,auVar10);
    auVar7._16_8_ = local_ae0;
    auVar7._0_16_ = auVar5;
    auVar7._24_8_ = uStack_ad8;
    auVar6._16_8_ = uStack_230;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_228;
    auVar11 = vpmaddwd_avx2(auVar7,auVar6);
    auVar6 = vpaddd_avx2(auVar8,auVar10);
    auVar7 = vpaddd_avx2(auVar9,auVar11);
    auVar9 = vpsubd_avx2(auVar9,auVar11);
    auVar10 = vpsubd_avx2(auVar8,auVar10);
    auVar19._16_8_ = uStack_2f0;
    auVar19._0_16_ = auVar27;
    auVar19._24_8_ = uStack_2e8;
    auVar6 = vpaddd_avx2(auVar6,auVar19);
    auVar18._16_8_ = uStack_2f0;
    auVar18._0_16_ = auVar27;
    auVar18._24_8_ = uStack_2e8;
    auVar7 = vpaddd_avx2(auVar7,auVar18);
    auVar17._16_8_ = uStack_2f0;
    auVar17._0_16_ = auVar27;
    auVar17._24_8_ = uStack_2e8;
    auVar8 = vpaddd_avx2(auVar9,auVar17);
    auVar16._16_8_ = uStack_2f0;
    auVar16._0_16_ = auVar27;
    auVar16._24_8_ = uStack_2e8;
    auVar9 = vpaddd_avx2(auVar10,auVar16);
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(uVar26));
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(uVar26));
    auVar8 = vpsrad_avx2(auVar8,ZEXT416(uVar26));
    auVar9 = vpsrad_avx2(auVar9,ZEXT416(uVar26));
    auVar6 = vpackssdw_avx2(auVar6,auVar8);
    auVar7 = vpackssdw_avx2(auVar7,auVar9);
    auVar8 = vpunpcklwd_avx2(auVar6,auVar7);
    auVar6 = vpunpckhwd_avx2(auVar6,auVar7);
    local_bc0._0_32_ = vpunpckldq_avx2(auVar8,auVar6);
    local_be0 = vpunpckhdq_avx2(auVar8,auVar6);
    if (local_d34 != 0xf) {
      local_a54 = (byte)local_d34;
      uVar25 = (short)(1 << (local_a54 & 0x1f)) - 1;
      auVar29 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,2);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,3);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,4);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,5);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,6);
      auVar29 = vpinsrw_avx(auVar29,(uint)uVar25,7);
      auVar30 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,2);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,3);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,4);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,5);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,6);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,7);
      uStack_170 = auVar30._0_8_;
      uStack_168 = auVar30._8_8_;
      uVar25 = -(short)(1 << (local_a54 & 0x1f));
      auVar30 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,2);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,3);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,4);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,5);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,6);
      auVar30 = vpinsrw_avx(auVar30,(uint)uVar25,7);
      auVar28 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,2);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,3);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,4);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,5);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,6);
      auVar28 = vpinsrw_avx(auVar28,(uint)uVar25,7);
      auVar28 = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar28;
      auVar30 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
      uStack_1b0 = auVar30._0_8_;
      uStack_1a8 = auVar30._8_8_;
      auVar21._16_8_ = uStack_170;
      auVar21._0_16_ = auVar29;
      auVar21._24_8_ = uStack_168;
      auVar6 = vpminsw_avx2(local_bc0._0_32_,auVar21);
      auVar20._16_8_ = uStack_170;
      auVar20._0_16_ = auVar29;
      auVar20._24_8_ = uStack_168;
      auVar7 = vpminsw_avx2(local_be0,auVar20);
      auVar23._16_8_ = uStack_1b0;
      auVar23._0_16_ = auVar28;
      auVar23._24_8_ = uStack_1a8;
      local_bc0._0_32_ = vpmaxsw_avx2(auVar6,auVar23);
      auVar22._16_8_ = uStack_1b0;
      auVar22._0_16_ = auVar28;
      auVar22._24_8_ = uStack_1a8;
      local_be0 = vpmaxsw_avx2(auVar7,auVar22);
    }
    *local_a48 = local_bc0._0_8_;
    local_a48[1] = local_bc0._8_8_;
    local_a48[2] = local_be0._0_8_;
    local_a48[3] = local_be0._8_8_;
    *(undefined8 *)local_bc0._24_8_ = local_90;
    *(undefined8 *)(local_bc0._24_8_ + 8) = uStack_88;
    local_a48[6] = local_be0._16_8_;
    local_a48[7] = local_be0._24_8_;
    local_a48 = local_a48 + 8;
    local_cc4 = local_cc4 + 8;
  }
  return;
}

Assistant:

void itrans_dct2_h8_w4_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 4]);
    dct2_butterfly_h8_sse(src, 4, tmp, 4, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h4_avx2(tmp, dst, 8, 20 - bit_depth, bit_depth);
}